

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
list_buildable_dependencies_actions::module2
          (list_buildable_dependencies_actions *this,string *module)

{
  bool bVar1;
  size_type sVar2;
  
  bVar1 = std::operator==(module,"(unknown)");
  if (!bVar1) {
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->buildable_,module);
    if (sVar2 != 0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->deps_,module);
      return;
    }
    this->headers_ = true;
  }
  return;
}

Assistant:

void module2( std::string const & module )
    {
        if( module == "(unknown)" ) return;

        if( buildable_.count( module ) == 0 )
        {
            headers_ = true;
        }
        else
        {
            deps_.insert( module );
        }
    }